

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::SignCaseInstance::getInputValues
          (SignCaseInstance *this,int numValues,void **values)

{
  DataType dataType;
  pointer pSVar1;
  void *pvVar2;
  deUint32 dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int in_R9D;
  ulong uVar7;
  Random rnd;
  deRandom dStack_68;
  int local_58 [8];
  float local_38 [6];
  
  local_38[0] = -2.0;
  local_38[1] = 2.0;
  local_38[2] = -10000.0;
  local_38[3] = 10000.0;
  local_38[4] = -1e+08;
  local_38[5] = 1e+08;
  local_58[0] = -0x80;
  local_58[1] = 0x7f;
  local_58[2] = -0x8000;
  local_58[3] = 0x7fff;
  local_58[4] = -0x80000000;
  local_58[5] = 0x7fffffff;
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&dStack_68,dVar3 ^ 0x324);
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar1->varType).m_data.basic.type;
  uVar7 = (ulong)*(uint *)((long)&(pSVar1->varType).m_data + 4);
  iVar4 = glu::getDataTypeScalarSize(dataType);
  pvVar2 = *values;
  lVar5 = (long)iVar4 * 4;
  lVar6 = 0;
  if (dataType - TYPE_FLOAT < 4) {
    for (; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 0x3f800000;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 0xbf800000;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 0;
    }
    fillRandomScalars<float>
              ((Random *)&dStack_68,local_38[uVar7 * 2],local_38[uVar7 * 2 + 1],
               (void *)((long)pvVar2 + (long)(iVar4 * 3) * 4),(numValues + -3) * iVar4,(int)pvVar2);
  }
  else {
    for (; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 1;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 0xffffffff;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)pvVar2 + lVar6) = 0;
    }
    fillRandomScalars<int>
              ((Random *)&dStack_68,local_58[uVar7 * 2],local_58[uVar7 * 2 + 1],
               (void *)((long)pvVar2 + (long)(iVar4 * 3) * 4),(numValues + -3) * iVar4,in_R9D);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0], (float*)values[0] + scalarSize, +1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize, -1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize,  0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0], (int*)values[0] + scalarSize, +1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize, -1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize,  0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}